

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_room_height(parser *p)

{
  uint uVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  long lVar5;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"height");
    *(char *)((long)pvVar4 + 0x1b) = (char)uVar1;
    lVar5 = 8;
    do {
      iVar2 = strcmp("room template",*(char **)((long)&locality_names[0x25].name + lVar5));
      if (iVar2 == 0) {
        if (*(int *)((long)&room_builders[0].name + lVar5) < (int)(uVar1 & 0xff)) {
          return PARSE_ERROR_VAULT_TOO_BIG;
        }
        return PARSE_ERROR_NONE;
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x368);
    pVar3 = PARSE_ERROR_NO_ROOM_FOUND;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_room_height(struct parser *p) {
	struct room_template *t = parser_priv(p);
	size_t i;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	t->hgt = parser_getuint(p, "height");

	/* Make sure rooms are no higher than the room profiles allow. */
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq("room template", room_builders[i].name))
			break;
	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	if (t->hgt > room_builders[i].max_height)
		return PARSE_ERROR_VAULT_TOO_BIG;
	return PARSE_ERROR_NONE;
}